

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f77_wrap3.c
# Opt level: O0

void ftgtbh_(int *A1,int *A2,int *A3,int *A4,char *A5,int *A6,char *A7,char *A8,char *A9,int *A10,
            size_t C5,size_t C7,size_t C8,size_t C9)

{
  int maxfield;
  long fptr_00;
  fitsfile *__src;
  uint nelem;
  char *tfields_00;
  int iVar1;
  char *pcVar2;
  char **ppcVar3;
  char **ppcVar4;
  char **ppcVar5;
  size_t sVar6;
  size_t sVar7;
  uint elem_len;
  uint uVar8;
  uint uVar9;
  size_t local_160;
  unsigned_long local_148;
  uint local_128;
  uint local_11c;
  uint local_100;
  uint local_f4;
  uint local_d8;
  uint local_cc;
  int *status;
  long tfields;
  fitsfile *fptr;
  char *B9;
  uint B8M;
  uint B8N;
  char **B8;
  uint B7M;
  uint B7N;
  char **B7;
  long B6;
  uint B5M;
  uint B5N;
  char **B5;
  long B3;
  long B2;
  int *A6_local;
  char *A5_local;
  int *A4_local;
  int *A3_local;
  int *A2_local;
  int *A1_local;
  
  fptr = (fitsfile *)0x0;
  tfields = (long)gFitsFiles[*A1];
  B2 = (long)A6;
  A6_local = (int *)A5;
  A5_local = (char *)A4;
  A4_local = A3;
  A3_local = A2;
  A2_local = A1;
  ffgkyj((fitsfile *)tfields,"TFIELDS",(long *)&status,(char *)0x0,A10);
  tfields_00 = A5_local;
  fptr_00 = tfields;
  maxfield = (int)status;
  B3 = (long)*A3_local;
  B5 = (char **)(long)*A4_local;
  elem_len = (uint)C5;
  iVar1 = num_elem((char *)A6_local,elem_len,(int)status,-1);
  if (iVar1 < 2) {
    local_cc = 1;
  }
  else {
    local_cc = num_elem((char *)A6_local,elem_len,(int)status,-1);
  }
  B6._4_4_ = local_cc;
  local_d8 = elem_len;
  if (C5 <= gMinStrLen) {
    local_d8 = (uint)gMinStrLen;
  }
  B6._0_4_ = local_d8 + 1;
  _B5M = (char **)malloc((ulong)local_cc << 3);
  pcVar2 = (char *)malloc((ulong)(B6._4_4_ * (int)B6));
  ppcVar3 = _B5M;
  uVar8 = B6._4_4_;
  iVar1 = (int)B6;
  *_B5M = pcVar2;
  pcVar2 = f2cstrv2((char *)A6_local,*_B5M,elem_len,(int)B6,B6._4_4_);
  ppcVar3 = vindex(ppcVar3,iVar1,uVar8,pcVar2);
  B7 = (char **)(long)*(int *)B2;
  uVar8 = (uint)C7;
  iVar1 = num_elem(A7,uVar8,(int)status,-1);
  if (iVar1 < 2) {
    local_f4 = 1;
  }
  else {
    local_f4 = num_elem(A7,uVar8,(int)status,-1);
  }
  B8._4_4_ = local_f4;
  local_100 = uVar8;
  if (C7 <= gMinStrLen) {
    local_100 = (uint)gMinStrLen;
  }
  B8._0_4_ = local_100 + 1;
  _B7M = (char **)malloc((ulong)local_f4 << 3);
  pcVar2 = (char *)malloc((ulong)(B8._4_4_ * (int)B8));
  ppcVar4 = _B7M;
  uVar9 = B8._4_4_;
  iVar1 = (int)B8;
  *_B7M = pcVar2;
  pcVar2 = f2cstrv2(A7,*_B7M,uVar8,(int)B8,B8._4_4_);
  ppcVar4 = vindex(ppcVar4,iVar1,uVar9,pcVar2);
  uVar9 = (uint)C8;
  iVar1 = num_elem(A8,uVar9,(int)status,-1);
  if (iVar1 < 2) {
    local_11c = 1;
  }
  else {
    local_11c = num_elem(A8,uVar9,(int)status,-1);
  }
  B9._4_4_ = local_11c;
  local_128 = uVar9;
  if (C8 <= gMinStrLen) {
    local_128 = (uint)gMinStrLen;
  }
  B9._0_4_ = local_128 + 1;
  _B8M = (char **)malloc((ulong)local_11c << 3);
  pcVar2 = (char *)malloc((ulong)(B9._4_4_ * (int)B9));
  ppcVar5 = _B8M;
  nelem = B9._4_4_;
  iVar1 = (int)B9;
  *_B8M = pcVar2;
  pcVar2 = f2cstrv2(A8,*_B8M,uVar9,(int)B9,B9._4_4_);
  ppcVar5 = vindex(ppcVar5,iVar1,nelem,pcVar2);
  if (gMinStrLen < C9) {
    local_148 = C9;
  }
  else {
    local_148 = gMinStrLen;
  }
  fptr = (fitsfile *)malloc(local_148 + 1);
  *(undefined1 *)((long)&fptr->HDUposition + C9) = 0;
  memcpy(fptr,A9,C9);
  pcVar2 = kill_trailing((char *)fptr,' ');
  ffghtb((fitsfile *)fptr_00,maxfield,&B3,(long *)&B5,(int *)tfields_00,ppcVar3,(long *)&B7,ppcVar4,
         ppcVar5,pcVar2,A10);
  *A3_local = (int)B3;
  *A4_local = (int)B5;
  c2fstrv2(*_B5M,(char *)A6_local,(int)B6,elem_len,B6._4_4_);
  free(*_B5M);
  free(_B5M);
  *(int *)B2 = (int)B7;
  c2fstrv2(*_B7M,A7,(int)B8,uVar8,B8._4_4_);
  free(*_B7M);
  free(_B7M);
  c2fstrv2(*_B8M,A8,(int)B9,uVar9,B9._4_4_);
  free(*_B8M);
  free(_B8M);
  __src = fptr;
  if (fptr != (fitsfile *)0x0) {
    sVar6 = strlen((char *)fptr);
    if (sVar6 < C9) {
      local_160 = strlen((char *)fptr);
    }
    else {
      local_160 = C9;
    }
    memcpy(A9,__src,local_160);
    sVar6 = strlen((char *)fptr);
    if (sVar6 < C9) {
      sVar6 = strlen((char *)fptr);
      sVar7 = strlen((char *)fptr);
      memset(A9 + sVar6,0x20,C9 - sVar7);
    }
    free(fptr);
  }
  return;
}

Assistant:

CFextern VOID_cfF(FTGTBH,ftgtbh)
CFARGT14(NCF,DCF,ABSOFT_cf2(VOID),FITSUNIT,PLONG,PLONG,PINT,PSTRINGV,PLONG,PSTRINGV,PSTRINGV,PSTRING,PINT,CF_0,CF_0,CF_0,CF_0))
{
   QCF(FITSUNIT,1)
   QCF(PLONG,2)
   QCF(PLONG,3)
   QCF(PINT,4)
   QCF(PSTRINGV,5)
   QCF(PLONG,6)
   QCF(PSTRINGV,7)
   QCF(PSTRINGV,8)
   QCF(PSTRING,9)
   QCF(PINT,10)

   fitsfile *fptr;
   long tfields;
   int *status;

   fptr = TCF(ftgtbh,FITSUNIT,1,0);
   status =  TCF(ftgtbh,PINT,10,0);
   ffgkyj( fptr, "TFIELDS", &tfields, 0, status );

   ffghtb(   fptr, (int)tfields
             TCF(ftgtbh,PLONG,2,1)
             TCF(ftgtbh,PLONG,3,1)
             TCF(ftgtbh,PINT,4,1)
             TCF(ftgtbh,PSTRINGV,5,1)
             TCF(ftgtbh,PLONG,6,1)
             TCF(ftgtbh,PSTRINGV,7,1)
             TCF(ftgtbh,PSTRINGV,8,1)
             TCF(ftgtbh,PSTRING,9,1)
             , status );

   RCF(FITSUNIT,1)
   RCF(PLONG,2)
   RCF(PLONG,3)
   RCF(PINT,4)
   RCF(PSTRINGV,5)
   RCF(PLONG,6)
   RCF(PSTRINGV,7)
   RCF(PSTRINGV,8)
   RCF(PSTRING,9)
   RCF(PINT,10)
}